

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  time_t tVar6;
  GLFWwindow *handle;
  GLchar *pGVar7;
  ostream *poVar8;
  long lVar9;
  int i;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double in_stack_ffffffffffcf2950;
  GLchar *fragCode;
  GLuint cursor;
  GLfloat delta_time;
  double in_stack_ffffffffffcf2970;
  GLchar *computeCode;
  GLchar *vertCode;
  GLuint vel;
  GLuint timebuffer;
  GLuint pos;
  GLuint vao;
  GLchar infolog [512];
  vec4 velocities [100000];
  vec4 positions [100000];
  
  lVar9 = 0;
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  delta_time = 0.1;
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  handle = glfwCreateWindow(0x780,0x438,"particles",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  glfwMakeContextCurrent(handle);
  glfwSwapInterval(1);
  gladLoadGL();
  memset(positions,0,1600000);
  memset(velocities,0,1600000);
  for (lVar10 = 0; lVar10 != 100000; lVar10 = lVar10 + 1) {
    iVar1 = rand();
    dVar11 = (double)((float)iVar1 * 4.656613e-10 * 8.0);
    dVar12 = sin((double)(int)lVar10);
    dVar13 = cos((double)(int)lVar10);
    auVar14._0_8_ = dVar11 * dVar12;
    auVar14._8_8_ = dVar11 * dVar13;
    auVar15 = divpd(auVar14,_DAT_00114020);
    *(ulong *)((long)&positions[0].field_0 + lVar9) =
         CONCAT44((float)auVar15._8_8_,(float)auVar15._0_8_);
    *(undefined8 *)((long)&positions[0].field_0 + lVar9 + 8) = 0;
    *(undefined8 *)((long)&velocities[0].field_0 + lVar9) = 0;
    *(undefined8 *)((long)&velocities[0].field_0 + lVar9 + 8) = 0;
    lVar9 = lVar9 + 0x10;
  }
  (*glad_glCreateVertexArrays)(1,&vao);
  (*glad_glBindVertexArray)(vao);
  (*glad_glCreateBuffers)(1,&pos);
  (*glad_glCreateBuffers)(1,&timebuffer);
  (*glad_glCreateBuffers)(1,&vel);
  (*glad_glCreateBuffers)(1,&cursor);
  (*glad_glNamedBufferData)(vel,1600000,velocities,0x88e4);
  (*glad_glNamedBufferData)(pos,1600000,positions,0x88e4);
  (*glad_glNamedBufferData)(timebuffer,4,&delta_time,0x88e8);
  (*glad_glNamedBufferData)(cursor,8,&defaultCursor,0x88e8);
  (*glad_glBindBufferBase)(0x90d2,0,pos);
  (*glad_glBindBufferBase)(0x90d2,1,vel);
  (*glad_glBindBufferBase)(0x90d2,2,cursor);
  (*glad_glBindBufferBase)(0x90d2,3,timebuffer);
  std::__cxx11::string::string((string *)infolog,"shader.vert",(allocator *)&fragCode);
  pGVar7 = LoadShader((string *)infolog);
  std::__cxx11::string::~string((string *)infolog);
  vertCode = pGVar7;
  std::__cxx11::string::string((string *)infolog,"shader.frag",(allocator *)&computeCode);
  pGVar7 = LoadShader((string *)infolog);
  std::__cxx11::string::~string((string *)infolog);
  fragCode = pGVar7;
  std::__cxx11::string::string
            ((string *)infolog,"cursor.glsl",(allocator *)&stack0xffffffffffcf2950);
  pGVar7 = LoadShader((string *)infolog);
  std::__cxx11::string::~string((string *)infolog);
  computeCode = pGVar7;
  GVar2 = (*glad_glCreateShader)(0x8b31);
  GVar3 = (*glad_glCreateShader)(0x8b30);
  GVar4 = (*glad_glCreateShader)(0x91b9);
  (*glad_glShaderSource)(GVar2,1,&vertCode,(GLint *)0x0);
  (*glad_glShaderSource)(GVar3,1,&fragCode,(GLint *)0x0);
  (*glad_glShaderSource)(GVar4,1,&computeCode,(GLint *)0x0);
  (*glad_glCompileShader)(GVar2);
  (*glad_glGetShaderInfoLog)(GVar2,0x200,(GLsizei *)0x0,infolog);
  poVar8 = std::operator<<((ostream *)&std::cout,infolog);
  std::endl<char,std::char_traits<char>>(poVar8);
  (*glad_glCompileShader)(GVar3);
  (*glad_glGetShaderInfoLog)(GVar3,0x200,(GLsizei *)0x0,infolog);
  poVar8 = std::operator<<((ostream *)&std::cout,infolog);
  std::endl<char,std::char_traits<char>>(poVar8);
  (*glad_glCompileShader)(GVar4);
  (*glad_glGetShaderInfoLog)(GVar4,0x200,(GLsizei *)0x0,infolog);
  poVar8 = std::operator<<((ostream *)&std::cout,infolog);
  std::endl<char,std::char_traits<char>>(poVar8);
  GVar5 = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(GVar5,GVar2);
  (*glad_glAttachShader)(GVar5,GVar3);
  (*glad_glLinkProgram)(GVar5);
  (*glad_glDeleteShader)(GVar2);
  (*glad_glDeleteShader)(GVar3);
  (*glad_glGetProgramInfoLog)(GVar5,0x200,(GLsizei *)0x0,infolog);
  poVar8 = std::operator<<((ostream *)&std::cout,infolog);
  std::endl<char,std::char_traits<char>>(poVar8);
  GVar2 = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(GVar2,GVar4);
  (*glad_glLinkProgram)(GVar2);
  (*glad_glDeleteShader)(GVar4);
  (*glad_glGetProgramInfoLog)(GVar2,0x200,(GLsizei *)0x0,infolog);
  poVar8 = std::operator<<((ostream *)&std::cout,infolog);
  std::endl<char,std::char_traits<char>>(poVar8);
  (*glad_glViewport)(0,0,0x780,0x438);
  (*glad_glClearColor)(0.05,0.05,0.05,1.0);
  (*glad_glPointSize)(2.0);
  while( true ) {
    iVar1 = glfwWindowShouldClose(handle);
    if (iVar1 != 0) break;
    (*glad_glClear)(0x4000);
    glfwPollEvents();
    glfwGetCursorPos(handle,(double *)&stack0xffffffffffcf2950,(double *)&stack0xffffffffffcf2970);
    auVar15._0_8_ = in_stack_ffffffffffcf2950 + -960.0;
    auVar15._8_8_ = in_stack_ffffffffffcf2970 + -540.0;
    auVar15 = divpd(auVar15,_DAT_00114040);
    in_stack_ffffffffffcf2950 = auVar15._0_8_ * 2.0;
    in_stack_ffffffffffcf2970 = auVar15._8_8_ * -2.0;
    (*glad_glNamedBufferSubData)(cursor,0,8,&stack0xffffffffffcf29a0);
    (*glad_glUseProgram)(GVar2);
    (*glad_glDispatchCompute)(100,1,1);
    (*glad_glUseProgram)(GVar5);
    (*glad_glDrawArraysInstanced)(0,0,1,100000);
    glfwSwapBuffers(handle);
  }
  (*glad_glDeleteProgram)(GVar5);
  (*glad_glDeleteProgram)(GVar2);
  if (vertCode != (GLchar *)0x0) {
    operator_delete__(vertCode);
  }
  if (fragCode != (GLchar *)0x0) {
    operator_delete__(fragCode);
  }
  if (computeCode != (GLchar *)0x0) {
    operator_delete__(computeCode);
  }
  glfwDestroyWindow(handle);
  glfwTerminate();
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  srand(time(0));

  const GLfloat delta_time = 0.1f;

  //Window Setup
  glfwInit();

  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);

  GLFWwindow* window = glfwCreateWindow(SCREENX, SCREENY, "particles", nullptr, nullptr);
  glfwMakeContextCurrent(window);
  glfwSwapInterval(1);

  gladLoadGL();

  //Setup Initial Positions/Velocities
  glm::vec4 positions[NUM_PARTICLES];
  glm::vec4 velocities[NUM_PARTICLES];
  for(int i = 0; i < NUM_PARTICLES; i++) {
    float r = (float)rand() / RAND_MAX;
    r *= 8;
    float velx = r * sin(i) / 10;
    float vely = r * cos(i) / 10;
    positions[i] = glm::vec4(velx, vely, 0.0f, 0.0f);
    velocities[i] = glm::vec4(0.0f, 0.0f, 0.0f, 0.0f);
  }

  GLuint vao, pos, timebuffer, vel, cursor;

  /**
  * VAO Setup - Even though we'll be sourcing all of our positions from a shader storage buffer,
  * a VAO must be bound for drawing, so let's just create an empty one. We also don't need a VBO
  * since all our rendering will be points
  */
  glCreateVertexArrays(1, &vao);
  glBindVertexArray(vao);

  /**
  * Buffer setup - We'll need 4 SSBOs, one for the position of each point, one for velocity,
  * one for cursor position, and one for delta_time. As cursor and delta_time are small, these
  * could have been implemented using regular uniforms, but I opted for consistency instead
  */
  glCreateBuffers(1, &pos);
  glCreateBuffers(1, &timebuffer);
  glCreateBuffers(1, &vel);
  glCreateBuffers(1, &cursor);
  glNamedBufferData(vel, sizeof(velocities), velocities, GL_STATIC_DRAW);
  glNamedBufferData(pos, sizeof(positions), positions, GL_STATIC_DRAW);
  glNamedBufferData(timebuffer, sizeof(GLfloat), &delta_time, GL_DYNAMIC_DRAW);
  glNamedBufferData(cursor, 2 * sizeof(GLfloat), glm::value_ptr(defaultCursor), GL_DYNAMIC_DRAW);

  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, pos);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, vel);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, cursor);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, timebuffer);


  /*
  * Basic Shader Setup - This is standard shader loading and compilation. The only difference is that the compute
  * shader must be linked by itself in a separate program
  */
  const GLchar* vertCode = LoadShader("shader.vert");
  const GLchar* fragCode = LoadShader("shader.frag");
  const GLchar* computeCode = LoadShader("cursor.glsl");

  GLuint vertShader = glCreateShader(GL_VERTEX_SHADER);
  GLuint fragShader = glCreateShader(GL_FRAGMENT_SHADER);
  GLuint computeShader = glCreateShader(GL_COMPUTE_SHADER);

  glShaderSource(vertShader, 1, &vertCode, nullptr);
  glShaderSource(fragShader, 1, &fragCode, nullptr);
  glShaderSource(computeShader, 1, &computeCode, nullptr);
  GLchar infolog[512];
  glCompileShader(vertShader);
  glGetShaderInfoLog(vertShader, 512, nullptr, infolog);

  std::cout << infolog << std::endl;

  glCompileShader(fragShader);
  glGetShaderInfoLog(fragShader, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  glCompileShader(computeShader);
  glGetShaderInfoLog(computeShader, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  GLuint shaderProgram = glCreateProgram();
  glAttachShader(shaderProgram, vertShader);
  glAttachShader(shaderProgram, fragShader);
  glLinkProgram(shaderProgram);
  glDeleteShader(vertShader);
  glDeleteShader(fragShader);

  glGetProgramInfoLog(shaderProgram, 512, nullptr, infolog);

  std::cout << infolog << std::endl;

  GLuint computeProgram = glCreateProgram();
  glAttachShader(computeProgram, computeShader);
  glLinkProgram(computeProgram);
  glDeleteShader(computeShader);

  glGetProgramInfoLog(computeProgram, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  /**
  * Setup some basic properties for screen size, background color and point size
  * 2.0 Point Size was used to make it easier to see
  */
  glViewport(0, 0, SCREENX, SCREENY);
  glClearColor(0.05f, 0.05, 0.05f, 1.0f);
  glPointSize(2.0f);

  // Draw Loop
  while(glfwWindowShouldClose(window) == 0) {
    glClear(GL_COLOR_BUFFER_BIT);
    /**
    * Get our cursor coordinates in normalized device coordinates
    */
    glfwPollEvents();
    double cursorx;
    double cursory;
    glfwGetCursorPos(window, &cursorx, &cursory);

    cursorx = cursorx - (SCREENX / 2);
    cursorx /= SCREENX;
    cursorx *= 2;

    cursory = cursory - (SCREENY / 2);
    cursory /= SCREENY;
    cursory *= -2;

    /**
    * Copy over the cursor position into the buffer
    */
    glm::vec2 current_cursor = glm::vec2(cursorx, cursory);

    glNamedBufferSubData(cursor, 0, 2 * sizeof(GLfloat), glm::value_ptr(current_cursor));

    /**
    * Fire off our compute shader run. Since we want to simulate 100000 particles, and our work group size is 1000
    * we need to dispatch 100 work groups
    */
    glUseProgram(computeProgram);
    glDispatchCompute(NUM_PARTICLES / WORK_GROUP_SIZE, 1, 1);

    /**
    * Draw the particles
    */
    glUseProgram(shaderProgram);
    glDrawArraysInstanced(GL_POINTS, 0, 1, NUM_PARTICLES);


    glfwSwapBuffers(window);
  }

  /**
  * We're done now, just need to free up our resources
  */

  //OpenGL Shutdown
  glDeleteProgram(shaderProgram);
  glDeleteProgram(computeProgram);
  delete[] vertCode;
  delete[] fragCode;
  delete[] computeCode;

  //Window Shutdown
  glfwDestroyWindow(window);
  glfwTerminate();
  return 0;
}